

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * printfTempBuf(sqlite3_str *pAccum,sqlite3_int64 n)

{
  sqlite3 *in_RSI;
  long in_RDI;
  char *z;
  u8 in_stack_ffffffffffffffdf;
  char *local_8;
  
  if (*(char *)(in_RDI + 0x1c) == '\0') {
    if (((long)(ulong)*(uint *)(in_RDI + 0x10) < (long)in_RSI) &&
       ((long)(ulong)*(uint *)(in_RDI + 0x14) < (long)in_RSI)) {
      sqlite3StrAccumSetError((StrAccum *)&DAT_aaaaaaaaaaaaaaaa,in_stack_ffffffffffffffdf);
      local_8 = (char *)0x0;
    }
    else {
      local_8 = (char *)sqlite3DbMallocRaw(in_RSI,0xaaaaaaaaaaaaaaaa);
      if (local_8 == (char *)0x0) {
        sqlite3StrAccumSetError((StrAccum *)0x0,in_stack_ffffffffffffffdf);
      }
    }
  }
  else {
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

static char *printfTempBuf(sqlite3_str *pAccum, sqlite3_int64 n){
  char *z;
  if( pAccum->accError ) return 0;
  if( n>pAccum->nAlloc && n>pAccum->mxAlloc ){
    sqlite3StrAccumSetError(pAccum, SQLITE_TOOBIG);
    return 0;
  }
  z = sqlite3DbMallocRaw(pAccum->db, n);
  if( z==0 ){
    sqlite3StrAccumSetError(pAccum, SQLITE_NOMEM);
  }
  return z;
}